

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O2

void __thiscall
tonk::SenderBandwidthControl::OnReceiverFeedback(SenderBandwidthControl *this,BandwidthShape shape)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = shape.AppBPS;
  this->RecoverySendCost = (int)(1024.0 / shape.FECRate);
  if ((this->Params).IgnoreReceiverFeedback == true) {
    (this->Shape).AppBPS = (this->Params).MaximumBPS;
    return;
  }
  uVar2 = 1000;
  if (999 < uVar3) {
    uVar1 = (this->Params).MaximumBPS;
    uVar2 = uVar3;
    if (uVar1 < uVar3) {
      uVar2 = uVar1;
    }
    if (uVar1 == 0) {
      uVar2 = uVar3;
    }
  }
  (this->Shape).AppBPS = uVar2;
  (this->Shape).FECRate = shape.FECRate;
  return;
}

Assistant:

void SenderBandwidthControl::OnReceiverFeedback(BandwidthShape shape)
{
    // Update recovery send cost
    RecoverySendCost = static_cast<int>(kReliableRewardTokens / shape.FECRate);

    // Ignore receiver feedback?
    if (Params.IgnoreReceiverFeedback) {
        Shape.AppBPS = Params.MaximumBPS;
        return;
    }

    // Bound shape
    if (shape.AppBPS < protocol::kMinimumBytesPerSecond) {
        shape.AppBPS = protocol::kMinimumBytesPerSecond;
    }
    else if (shape.AppBPS > Params.MaximumBPS && Params.MaximumBPS > 0) {
        shape.AppBPS = Params.MaximumBPS;
    }

    Shape = shape;
}